

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeRange::ShapeRange(ShapeRange *this,SizeRange *range)

{
  RangeValue *this_00;
  RangeValue local_30;
  
  RangeValue::RangeValue(&this->_minimum);
  this_00 = &this->_maximum;
  RangeValue::RangeValue(this_00);
  RangeValue::RangeValue(&local_30,range->lowerbound_);
  (this->_minimum)._isUnbound = local_30._isUnbound;
  *(undefined7 *)&(this->_minimum).field_0x1 = local_30._1_7_;
  (this->_minimum)._val = local_30._val;
  if (range->upperbound_ < 0) {
    RangeValue::RangeValue(&local_30);
  }
  else {
    RangeValue::RangeValue(&local_30,range->upperbound_);
  }
  this_00->_isUnbound = local_30._isUnbound;
  *(undefined7 *)&this_00->field_0x1 = local_30._1_7_;
  (this->_maximum)._val = local_30._val;
  return;
}

Assistant:

ShapeRange::ShapeRange(const Specification::SizeRange& range) {
    _minimum = static_cast<size_t>(range.lowerbound());
    int64_t max = range.upperbound();
    if (max < 0) {
        _maximum = RangeValue();
    }
    else {
        _maximum = static_cast<size_t>(max);
    }
}